

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDefs.cpp
# Opt level: O3

void vk::checkResult(VkResult result,char *msg,char *file,int line)

{
  ResourceError *this;
  size_t sVar1;
  ostringstream msgStr;
  Enum<vk::VkResult,_4UL> local_1c0 [2];
  ostringstream local_1a0 [376];
  
  if (result == VK_SUCCESS) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  }
  local_1c0[0].m_getName = getResultName;
  local_1c0[0].m_value = result;
  tcu::Format::Enum<vk::VkResult,_4UL>::toStream(local_1c0,(ostream *)local_1a0);
  this = (ResourceError *)__cxa_allocate_exception(0x38);
  if (0xfffffffd < (uint)result) {
    std::__cxx11::stringbuf::str();
    tcu::ResourceError::ResourceError(this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
    *(undefined ***)&(this->super_TestException).super_Exception = &PTR__OutOfMemoryError_00d1a460;
    *(VkResult *)&(this->super_TestException).field_0x34 = result;
    __cxa_throw(this,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError((TestError *)this,(char *)local_1c0[0].m_getName,(char *)0x0,file,line);
  *(undefined ***)&(this->super_TestException).super_Exception = &PTR__Error_00d1a430;
  *(VkResult *)&(this->super_TestException).field_0x34 = result;
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

void checkResult (VkResult result, const char* msg, const char* file, int line)
{
	if (result != VK_SUCCESS)
	{
		std::ostringstream msgStr;
		if (msg)
			msgStr << msg << ": ";

		msgStr << getResultStr(result);

		if (isOutOfMemoryError(result))
			throw OutOfMemoryError(result, msgStr.str().c_str(), DE_NULL, file, line);
		else
			throw Error(result, msgStr.str().c_str(), DE_NULL, file, line);
	}
}